

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void **in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000030;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  Mat ATX;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  int K;
  int M;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined1 in_stack_00000f53;
  int in_stack_00000f54;
  Mat *in_stack_00000f58;
  Mat *in_stack_00000f60;
  Mat *in_stack_00000f68;
  Mat *in_stack_00000f70;
  Mat *in_stack_00000f78;
  undefined4 in_stack_fffffffffffff424;
  undefined4 in_stack_fffffffffffff428;
  undefined4 in_stack_fffffffffffff42c;
  int in_stack_fffffffffffff434;
  int in_stack_fffffffffffff438;
  int in_stack_fffffffffffff43c;
  Mat *in_stack_fffffffffffff440;
  undefined8 in_stack_fffffffffffff480;
  void **ppvVar5;
  int in_stack_fffffffffffff488;
  int in_stack_fffffffffffff48c;
  undefined8 in_stack_fffffffffffff490;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  int *in_stack_fffffffffffff4a8;
  int *in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b8;
  void **local_af8;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a3c;
  int local_a38;
  int local_a34;
  int local_a30;
  int local_a2c;
  int local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined4 local_a08;
  long *local_a00;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined8 local_9e0;
  void *local_9d8;
  int *local_9d0;
  long local_9c8;
  undefined4 local_9c0;
  long *local_9b8;
  undefined4 local_9b0;
  int local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  long local_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined4 local_978;
  Allocator *local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined8 local_950;
  void *local_948;
  int *local_940;
  size_t local_938;
  int local_930;
  Allocator *local_928;
  undefined4 local_920;
  int local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  long local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  void **local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  void *local_8d8;
  int *local_8d0;
  ulong local_8c8;
  undefined4 local_8c0;
  long *local_8b8;
  int local_8b0;
  int local_8ac;
  int local_8a8;
  int local_8a4;
  undefined4 local_8a0;
  Mat *local_898;
  void *local_890;
  int *local_888;
  ulong local_880;
  undefined4 local_878;
  long *local_870;
  int max_ii_00;
  int i_00;
  undefined4 uVar6;
  Mat *in_stack_fffffffffffff7a8;
  Mat *A_00;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  void *local_830;
  int *local_828;
  ulong local_820;
  undefined4 local_818;
  long *local_810;
  int local_808;
  int local_804;
  int local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  long local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  long *local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined8 local_7a8;
  void *local_7a0;
  int *local_798;
  long local_790;
  undefined4 local_788;
  long *local_780;
  undefined4 local_778;
  int local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  int in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  int in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  int in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  int local_734;
  void *local_720;
  int *local_718;
  long local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  int local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  long local_6e0;
  Mat local_6d8;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  void **local_658;
  long local_648;
  void **local_640;
  void **local_638;
  undefined8 *local_630;
  void **local_620;
  void **local_610;
  undefined8 *local_600;
  undefined8 *local_5f0;
  void **local_5e0;
  void **local_5d0;
  void **local_5c0;
  void **local_5b0;
  void **local_5a0;
  Mat *local_590;
  undefined1 local_57d;
  int local_57c;
  void **local_578;
  undefined8 *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  Mat *in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  Mat *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  Mat *in_stack_fffffffffffffca0;
  Mat *in_stack_fffffffffffffca8;
  
  if (in_R9D == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a2c = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a2c = *(int *)(in_RDI + 0x30);
    }
    local_a28 = local_a2c * *(int *)(in_RDI + 0x18);
  }
  else {
    local_a28 = *(int *)(in_RDI + 0x2c);
  }
  local_66c = local_a28;
  if (in_R9D == 0) {
    local_a34 = *(int *)(in_RDI + 0x2c);
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a30 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a30 = *(int *)(in_RDI + 0x30);
    }
    local_a34 = local_a30 * *(int *)(in_RDI + 0x18);
  }
  local_670 = local_a34;
  if (in_stack_00000008 == 0) {
    local_a3c = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_a38 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_a38 = *(int *)(in_RSI + 0x30);
    }
    local_a3c = local_a38 * *(int *)(in_RSI + 0x18);
  }
  local_674 = local_a3c;
  local_668 = in_R9D;
  local_664 = in_R8D;
  local_658 = in_RDX;
  local_648 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff490 >> 0x20),(int)in_stack_fffffffffffff490,
             in_stack_fffffffffffff48c,in_stack_fffffffffffff488,
             (int)((ulong)in_stack_fffffffffffff480 >> 0x20),(int)in_stack_fffffffffffff480,
             (int *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             in_stack_fffffffffffff4a8,in_stack_fffffffffffff4b0,in_stack_fffffffffffff4b8);
  local_684 = (local_66c + -1 + local_678) / local_678;
  local_688 = (local_674 + -1 + local_67c) / local_67c;
  local_68c = (local_670 + -1 + local_680) / local_680;
  local_6d8.data = (void *)0x0;
  local_6d8.refcount = (int *)0x0;
  local_6d8.elemsize = 0;
  local_6d8.elempack = 0;
  local_6d8.allocator = (Allocator *)0x0;
  local_6d8.dims = 0;
  local_6d8.w = 0;
  local_6d8.h = 0;
  local_6d8.d = 0;
  local_6d8.c = 0;
  local_6d8.cstep = 0;
  Mat::create(in_stack_fffffffffffff440,in_stack_fffffffffffff43c,in_stack_fffffffffffff438,
              in_stack_fffffffffffff434,
              CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
              (Allocator *)CONCAT44(in_stack_fffffffffffff424,in_stack_00000030));
  local_720 = (void *)0x0;
  local_718 = (int *)0x0;
  local_710 = 0;
  local_708 = 0;
  local_700 = (long *)0x0;
  local_6f8 = 0;
  local_6f4 = 0;
  local_6f0 = 0;
  local_6ec = 0;
  local_6e8 = 0;
  local_6e0 = 0;
  Mat::create(in_stack_fffffffffffff440,in_stack_fffffffffffff43c,in_stack_fffffffffffff438,
              in_stack_fffffffffffff434,
              CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
              (Allocator *)CONCAT44(in_stack_fffffffffffff424,in_stack_00000030));
  iVar1 = local_688 * local_68c;
  for (local_734 = 0; local_734 < iVar1; local_734 = local_734 + 1) {
    iVar2 = (local_734 / local_68c) * local_67c;
    in_stack_fffffffffffff8bc = (local_734 % local_68c) * local_680;
    in_stack_fffffffffffff8b4 = local_674 - iVar2;
    piVar4 = std::min<int>((int *)&stack0xfffffffffffff8b4,&local_67c);
    in_stack_fffffffffffff8b8 = *piVar4;
    in_stack_fffffffffffff8ac = local_670 - in_stack_fffffffffffff8bc;
    piVar4 = std::min<int>((int *)&stack0xfffffffffffff8ac,&local_680);
    in_stack_fffffffffffff8b0 = *piVar4;
    local_7a0 = (void *)((long)local_720 +
                        (long)local_6f4 * (long)(in_stack_fffffffffffff8bc / local_680) * local_710
                        + local_6e0 * (iVar2 / local_67c) * local_710);
    local_630 = &local_7e8;
    local_768 = 1;
    local_76c = 1;
    local_770 = 1;
    local_774 = local_6f4;
    local_778 = 2;
    local_780 = local_700;
    local_788 = local_708;
    local_790 = local_710;
    local_798 = (int *)0x0;
    local_7c8 = local_700;
    local_7e8 = 0;
    local_7d8 = 0;
    local_7d0 = 0;
    local_7c0 = 0;
    local_7bc = 0;
    local_7b8 = 0;
    local_7b4 = 0;
    local_7b0 = 0;
    local_7a8 = 0;
    local_7e0 = 0;
    if (in_stack_00000008 == 0) {
      transpose_pack_B_tile
                (in_stack_fffffffffffffbe0,
                 (Mat *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
                 in_stack_fffffffffffffbc8);
    }
    else {
      pack_B_tile(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
                  in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc90);
    }
    local_620 = &local_7a0;
    if (local_798 != (int *)0x0) {
      LOCK();
      iVar2 = *local_798;
      *local_798 = *local_798 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (local_780 == (long *)0x0) {
          if (local_7a0 != (void *)0x0) {
            free(local_7a0);
          }
        }
        else {
          (**(code **)(*local_780 + 0x18))(local_780,local_7a0);
        }
      }
    }
    local_7a0 = (void *)0x0;
    local_790 = 0;
    local_788 = 0;
    local_778 = 0;
    local_774 = 0;
    local_770 = 0;
    local_76c = 0;
    local_768 = 0;
    in_stack_fffffffffffff8a4 = 0;
    in_stack_fffffffffffff8a0 = 0;
    local_798 = (int *)0x0;
  }
  local_640 = &local_830;
  local_830 = (void *)0x0;
  local_828 = (int *)0x0;
  local_820 = 0;
  local_818 = 0;
  local_810 = (long *)0x0;
  local_808 = 0;
  local_804 = 0;
  local_800 = 0;
  local_7fc = 0;
  local_7f8 = 0;
  local_7f0 = 0;
  if (((local_680 < local_670) || (local_664 == 3)) || (in_stack_00000010 != 0)) {
    Mat::create(in_stack_fffffffffffff440,in_stack_fffffffffffff43c,in_stack_fffffffffffff438,
                in_stack_fffffffffffff434,
                CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                (Allocator *)CONCAT44(in_stack_fffffffffffff424,in_stack_00000030));
  }
  for (local_834 = 0; local_834 < local_684; local_834 = local_834 + 1) {
    local_838 = local_834 * local_678;
    if (local_668 == 0) {
      if (*(int *)(local_648 + 0x28) == 3) {
        local_aa0 = *(int *)(local_648 + 0x38);
      }
      else {
        local_aa0 = *(int *)(local_648 + 0x30);
      }
      local_a9c = local_aa0 * *(int *)(local_648 + 0x18);
    }
    else {
      local_a9c = *(int *)(local_648 + 0x2c);
    }
    local_83c = local_a9c;
    if (local_668 == 0) {
      local_aa8 = *(int *)(local_648 + 0x2c);
    }
    else {
      if (*(int *)(local_648 + 0x28) == 3) {
        local_aa4 = *(int *)(local_648 + 0x38);
      }
      else {
        local_aa4 = *(int *)(local_648 + 0x30);
      }
      local_aa8 = local_aa4 * *(int *)(local_648 + 0x18);
    }
    local_840 = local_aa8;
    local_848 = local_a9c - local_838;
    piVar4 = std::min<int>(&local_848,&local_678);
    local_844 = *piVar4;
    local_638 = &local_890;
    local_890 = (void *)0x0;
    local_888 = (int *)0x0;
    local_880 = 0;
    local_878 = 0;
    local_870 = (long *)0x0;
    iVar1 = 0;
    iVar2 = 0;
    max_ii_00 = 0;
    i_00 = 0;
    uVar6 = 0;
    A_00 = (Mat *)0x0;
    if (((local_680 < local_840) || (local_664 == 3)) || (in_stack_00000010 != 0)) {
      iVar3 = get_omp_thread_num();
      local_8d8 = (void *)((long)local_830 + local_7f0 * iVar3 * local_820);
      local_8d0 = (int *)0x0;
      local_8c8 = local_820;
      local_8c0 = local_818;
      local_8b8 = local_810;
      local_8ac = local_804;
      local_8a8 = local_800;
      local_8a4 = 1;
      local_8a0 = local_7fc;
      local_898 = (Mat *)(((long)local_804 * (long)local_800 * local_820 + 0xf & 0xfffffffffffffff0)
                         / local_820);
      local_8b0 = local_808 + -1;
      if (local_808 == 4) {
        local_898 = (Mat *)((long)local_804 * (long)local_800);
      }
      if (&local_890 != &local_8d8) {
        if (local_888 != (int *)0x0) {
          LOCK();
          iVar1 = *local_888;
          *local_888 = *local_888 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_870 == (long *)0x0) {
              if (local_890 != (void *)0x0) {
                free(local_890);
              }
            }
            else {
              (**(code **)(*local_870 + 0x18))(local_870,local_890);
            }
          }
        }
        uVar6 = 0;
        local_890 = local_8d8;
        local_888 = local_8d0;
        local_880 = local_8c8;
        local_878 = local_8c0;
        local_870 = local_8b8;
        iVar1 = local_8b0;
        iVar2 = local_8ac;
        max_ii_00 = local_8a8;
        i_00 = local_8a4;
        A_00 = local_898;
      }
      local_610 = &local_8d8;
      if (local_8d0 != (int *)0x0) {
        LOCK();
        iVar3 = *local_8d0;
        *local_8d0 = *local_8d0 + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (local_8b8 == (long *)0x0) {
            if (local_8d8 != (void *)0x0) {
              free(local_8d8);
            }
          }
          else {
            (**(code **)(*local_8b8 + 0x18))(local_8b8,local_8d8);
          }
        }
      }
      local_8d8 = (void *)0x0;
      local_8c8 = 0;
      local_8c0 = 0;
      local_8b0 = 0;
      local_8ac = 0;
      local_8a8 = 0;
      local_8a4 = 0;
      local_8a0 = 0;
      local_898 = (Mat *)0x0;
      local_8d0 = (int *)0x0;
    }
    for (local_8dc = 0; local_8dc < local_674; local_8dc = local_67c + local_8dc) {
      local_8e4 = local_674 - local_8dc;
      piVar4 = std::min<int>(&local_8e4,&local_67c);
      local_8e0 = *piVar4;
      if (local_664 == 3) {
        pack_A_tile(A_00,in_stack_fffffffffffff7a8,i_00,max_ii_00,iVar2,iVar1);
      }
      if (local_664 == 3) {
        local_af8 = &local_890;
      }
      else {
        local_af8 = local_658;
      }
      local_8f0 = local_af8;
      for (local_8f4 = 0; local_8f4 < local_840; local_8f4 = local_680 + local_8f4) {
        local_8fc = local_840 - local_8f4;
        piVar4 = std::min<int>(&local_8fc,&local_680);
        local_8f8 = *piVar4;
        in_stack_fffffffffffffaa4 = get_omp_thread_num();
        in_stack_fffffffffffffaa8 = &local_6d8;
        in_stack_fffffffffffffaa0 = CONCAT13(1,(int3)in_stack_fffffffffffffaa0);
        local_948 = (void *)((long)local_6d8.data +
                            (long)local_6d8.w * (long)(local_8f4 / local_680) * local_6d8.elemsize +
                            local_6d8.cstep * (long)in_stack_fffffffffffffaa4 * local_6d8.elemsize);
        local_908 = (long)local_6d8.w;
        local_600 = &local_990;
        local_57c = local_8dc / local_67c;
        in_stack_fffffffffffffa90 = &local_a20;
        local_578 = &local_720;
        local_9d8 = (void *)((long)local_720 +
                            (long)local_6f4 * (long)(local_8f4 / local_680) * local_710 +
                            local_6e0 * local_57c * local_710);
        local_998 = (long)local_6f4;
        local_5f0 = &local_a20;
        local_910 = 1;
        local_914 = 1;
        local_918 = 1;
        local_91c = local_6d8.w;
        local_920 = 2;
        local_928 = local_6d8.allocator;
        local_930 = local_6d8.elempack;
        local_938 = local_6d8.elemsize;
        local_940 = (int *)0x0;
        local_958 = 0;
        local_95c = 0;
        local_960 = 0;
        local_964 = 0;
        local_970 = local_6d8.allocator;
        local_978 = 0;
        local_980 = 0;
        local_988 = 0;
        local_990 = 0;
        local_9a0 = 1;
        local_9a4 = 1;
        local_9a8 = 1;
        local_9ac = local_6f4;
        local_9b0 = 2;
        local_9b8 = local_700;
        local_9c0 = local_708;
        local_9c8 = local_710;
        local_9d0 = (int *)0x0;
        local_a00 = local_700;
        local_57d = 1;
        local_950 = 0;
        local_968 = 0;
        local_a20 = 0;
        local_a10 = 0;
        local_a08 = 0;
        local_9f8 = 0;
        local_9f4 = 0;
        local_9f0 = 0;
        local_9ec = 0;
        local_9e8 = 0;
        local_9e0 = 0;
        local_a18 = 0;
        if (local_8dc == 0) {
          if (local_668 == 0) {
            pack_A_tile(A_00,in_stack_fffffffffffff7a8,i_00,max_ii_00,iVar2,iVar1);
          }
          else {
            transpose_pack_A_tile
                      ((Mat *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                       (Mat *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                       in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a4
                       ,in_stack_fffffffffffff8a0);
          }
        }
        gemm_transB_packed_tile
                  (in_stack_00000f78,in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,
                   in_stack_00000f58,in_stack_00000f54,local_844,local_8dc,local_8e0,local_8f4,
                   local_8f8,(uint)(in_stack_00000010 == 0 && local_840 <= local_8f4 + local_680),
                   (bool)in_stack_00000f53);
        local_5e0 = &local_9d8;
        if (local_9d0 != (int *)0x0) {
          LOCK();
          iVar3 = *local_9d0;
          *local_9d0 = *local_9d0 + -1;
          UNLOCK();
          if (iVar3 == 1) {
            if (local_9b8 == (long *)0x0) {
              if (local_9d8 != (void *)0x0) {
                free(local_9d8);
              }
            }
            else {
              (**(code **)(*local_9b8 + 0x18))(local_9b8,local_9d8);
            }
          }
        }
        local_9d8 = (void *)0x0;
        local_9c8 = 0;
        local_9c0 = 0;
        local_9b0 = 0;
        local_9ac = 0;
        local_9a8 = 0;
        local_9a4 = 0;
        local_9a0 = 0;
        local_998 = 0;
        local_9d0 = (int *)0x0;
        ppvVar5 = &local_948;
        local_5d0 = ppvVar5;
        if (local_940 != (int *)0x0) {
          LOCK();
          iVar3 = *local_940;
          *local_940 = *local_940 + -1;
          UNLOCK();
          if (iVar3 == 1) {
            if (local_928 == (Allocator *)0x0) {
              if (local_948 != (void *)0x0) {
                free(local_948);
              }
            }
            else {
              (**(code **)(*(long *)local_928 + 0x18))(local_928,local_948);
            }
          }
        }
        *ppvVar5 = (void *)0x0;
        ppvVar5[2] = (void *)0x0;
        *(undefined4 *)(ppvVar5 + 3) = 0;
        *(undefined4 *)(ppvVar5 + 5) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
        *(undefined4 *)(ppvVar5 + 6) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
        *(undefined4 *)(ppvVar5 + 7) = 0;
        ppvVar5[8] = (void *)0x0;
        ppvVar5[1] = (void *)0x0;
      }
      if (in_stack_00000010 != 0) {
        transpose_unpack_output_tile
                  (in_stack_fffffffffffffaa8,
                   (Mat *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (int)((ulong)in_stack_fffffffffffffa98 >> 0x20),(int)in_stack_fffffffffffffa98,
                   (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),(int)in_stack_fffffffffffffa90);
      }
    }
    ppvVar5 = &local_890;
    local_5c0 = ppvVar5;
    if (local_888 != (int *)0x0) {
      LOCK();
      iVar1 = *local_888;
      *local_888 = *local_888 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_870 == (long *)0x0) {
          if (local_890 != (void *)0x0) {
            free(local_890);
          }
        }
        else {
          (**(code **)(*local_870 + 0x18))(local_870,local_890);
        }
      }
    }
    *ppvVar5 = (void *)0x0;
    ppvVar5[2] = (void *)0x0;
    *(undefined4 *)(ppvVar5 + 3) = 0;
    *(undefined4 *)(ppvVar5 + 5) = 0;
    *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
    *(undefined4 *)(ppvVar5 + 6) = 0;
    *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
    *(undefined4 *)(ppvVar5 + 7) = 0;
    ppvVar5[8] = (void *)0x0;
    ppvVar5[1] = (void *)0x0;
  }
  local_5b0 = &local_830;
  if (local_828 != (int *)0x0) {
    LOCK();
    iVar1 = *local_828;
    *local_828 = *local_828 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_810 == (long *)0x0) {
        if (local_830 != (void *)0x0) {
          free(local_830);
        }
      }
      else {
        (**(code **)(*local_810 + 0x18))(local_810,local_830);
      }
    }
  }
  local_830 = (void *)0x0;
  local_820 = 0;
  local_818 = 0;
  local_808 = 0;
  local_804 = 0;
  local_800 = 0;
  local_7fc = 0;
  local_7f8 = 0;
  local_7f0 = 0;
  local_828 = (int *)0x0;
  local_5a0 = &local_720;
  if (local_718 != (int *)0x0) {
    LOCK();
    iVar1 = *local_718;
    *local_718 = *local_718 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_700 == (long *)0x0) {
        if (local_720 != (void *)0x0) {
          free(local_720);
        }
      }
      else {
        (**(code **)(*local_700 + 0x18))(local_700,local_720);
      }
    }
  }
  local_720 = (void *)0x0;
  local_710 = 0;
  local_708 = 0;
  local_6f8 = 0;
  local_6f4 = 0;
  local_6f0 = 0;
  local_6ec = 0;
  local_6e8 = 0;
  local_6e0 = 0;
  local_718 = (int *)0x0;
  local_590 = &local_6d8;
  if (local_6d8.refcount != (int *)0x0) {
    LOCK();
    iVar1 = *local_6d8.refcount;
    *local_6d8.refcount = *local_6d8.refcount + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_6d8.allocator == (Allocator *)0x0) {
        if (local_6d8.data != (void *)0x0) {
          free(local_6d8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_6d8.allocator + 0x18))(local_6d8.allocator,local_6d8.data);
      }
    }
  }
  return 0;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}